

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O3

bool __thiscall ON_ObjRef::Read(ON_ObjRef *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  osnap_mode oVar3;
  int minor_version;
  int osmode;
  int major_version;
  int local_2c;
  ON__INT32 local_28;
  int local_24;
  
  local_24 = 0;
  local_2c = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&local_24,&local_2c);
  if (!bVar1) {
    return false;
  }
  if ((((local_24 == 1) && (bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_uuid), bVar1)) &&
      (bVar1 = ON_BinaryArchive::ReadComponentIndex(archive,&this->m_component_index), bVar1)) &&
     (((bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_geometry_type), bVar1 &&
       (bVar1 = ON_BinaryArchive::ReadPoint(archive,&this->m_point), bVar1)) &&
      ((bVar1 = ON_BinaryArchive::ReadInt(archive,&(this->m_evp).m_t_type), bVar1 &&
       ((bVar1 = ON_BinaryArchive::ReadComponentIndex(archive,&(this->m_evp).m_t_ci), bVar1 &&
        (bVar1 = ON_BinaryArchive::ReadDouble(archive,4,(this->m_evp).m_t), bVar1)))))))) {
    bVar1 = ON_BinaryArchive::ReadArray(archive,&this->m__iref);
    if ((!bVar1) || (local_2c < 1)) goto LAB_0055d204;
    bVar1 = ON_BinaryArchive::ReadInterval(archive,(ON_Interval *)&(this->m_evp).field_0x28);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadInterval(archive,(ON_Interval *)&(this->m_evp).field_0x38);
      if ((((bVar1) && (1 < local_2c)) &&
          (bVar1 = ON_BinaryArchive::ReadInterval(archive,(ON_Interval *)&(this->m_evp).field_0x48),
          bVar1)) && (2 < local_2c)) {
        local_28 = 0;
        bVar1 = ON_BinaryArchive::ReadInt(archive,&local_28);
        if (bVar1) {
          oVar3 = ON::OSnapMode(local_28);
          this->m_osnap_mode = oVar3;
        }
      }
      goto LAB_0055d204;
    }
  }
  bVar1 = false;
LAB_0055d204:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_ObjRef::Read( ON_BinaryArchive& archive )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version );
  if ( !rc )
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = archive.ReadUuid(m_uuid);
    if (!rc) break;

    rc = archive.ReadComponentIndex(m_component_index);
    if (!rc) break;

    rc = archive.ReadInt(&m_geometry_type);
    if (!rc) break;

    rc = archive.ReadPoint(m_point);
    if (!rc) break;

    // Prior to 13 July 2006, the evaluation parameters
    // m_evp were members of ON_ObjRef.  That's why the
    // m_evp fields are read directly rather than
    // using m_evp.Read().
    rc = archive.ReadInt(&m_evp.m_t_type);
    if (!rc) break;

    rc = archive.ReadComponentIndex(m_evp.m_t_ci);
    if (!rc) break;

    rc = archive.ReadDouble(4,m_evp.m_t);
    if (!rc) break;

    rc = archive.ReadArray(m__iref);
    if (!rc) break;

    if ( minor_version >= 1 )
    {
      // 1.1 IO fields
      rc = archive.ReadInterval(m_evp.m_s[0]);
      if (!rc) break;
      rc = archive.ReadInterval(m_evp.m_s[1]);
      if (!rc) break;
      if ( minor_version >= 2 )
      {
        rc = archive.ReadInterval(m_evp.m_s[2]);
        if (!rc) break;
        if (minor_version >= 3)
        {
          int osmode = 0;
          rc = archive.ReadInt(&osmode);
          if (!rc) break;
          m_osnap_mode = ON::OSnapMode(osmode);
        }
      }
    }

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}